

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CordOutputStream::Next(CordOutputStream *this,void **data,int *size)

{
  CordBuffer *this_00;
  byte bVar1;
  byte bVar2;
  State SVar3;
  ulong uVar4;
  ulong uVar5;
  CordRepFlat *pCVar6;
  CordRepFlat *pCVar7;
  sbyte sVar8;
  ulong uVar9;
  char cVar10;
  sbyte sVar11;
  int iVar12;
  size_t sVar13;
  int iVar14;
  ulong len;
  ulong uVar15;
  Span<char> SVar16;
  anon_union_16_2_39e9c77e_for_Rep_0 local_58;
  anon_union_16_2_b9f6da03_for_Rep_1 local_48;
  
  bVar1 = (this->cord_).contents_.data_.rep_.field_0.data[0];
  uVar9 = (ulong)(char)bVar1;
  if ((uVar9 & 1) == 0) {
    uVar4 = uVar9 >> 1;
  }
  else {
    uVar4 = ((this->cord_).contents_.data_.rep_.field_0.as_tree.rep)->length;
  }
  this_00 = &this->buffer_;
  bVar2 = (this->buffer_).rep_.field_0.short_rep.raw_size;
  cVar10 = (char)bVar2 >> 1;
  if ((bVar2 & 1) == 0) {
    pCVar7 = (this_00->rep_).field_0.long_rep.rep;
    sVar13 = (pCVar7->super_CordRep).length;
  }
  else {
    sVar13 = (size_t)cVar10;
    pCVar7 = (CordRepFlat *)(ulong)bVar2;
  }
  uVar4 = sVar13 + uVar4;
  uVar5 = 0x80;
  if (0x80 < uVar4) {
    uVar5 = uVar4;
  }
  len = this->size_hint_ - uVar4;
  uVar15 = len;
  if (this->size_hint_ < uVar4 || len == 0) {
    len = uVar5;
    uVar15 = 0xffffffffffffffff;
  }
  if (this->state_ < 4) {
    switch(this->state_) {
    case kFull:
      if ((bVar2 & 1) == 0) {
        sVar13 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).length;
      }
      else {
        sVar13 = (size_t)cVar10;
      }
      if (sVar13 == 0) {
        __assert_fail("buffer_.length() > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                      ,0x273,
                      "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
      }
      local_48.long_rep.rep = (this_00->rep_).field_0.long_rep.rep;
      local_48.long_rep.padding = (this->buffer_).rep_.field_0.long_rep.padding;
      (this_00->rep_).field_0.short_rep.raw_size = '\x01';
      absl::lts_20250127::Cord::Append(&this->cord_,(CordBuffer *)&local_48.long_rep);
      if (((ulong)local_48.long_rep.rep & 1) == 0) {
        absl::lts_20250127::cord_internal::CordRepFlat::Delete
                  (&(local_48.long_rep.rep)->super_CordRep);
      }
    case kEmpty:
      bVar1 = (this_00->rep_).field_0.short_rep.raw_size;
      pCVar6 = (CordRepFlat *)(ulong)bVar1;
      if ((bVar1 & 1) == 0) {
        pCVar6 = (this_00->rep_).field_0.long_rep.rep;
        sVar13 = (pCVar6->super_CordRep).length;
      }
      else {
        sVar13 = (size_t)((char)bVar1 >> 1);
      }
      if (sVar13 != 0) {
        __assert_fail("buffer_.length() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                      ,0x277,
                      "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
      }
      pCVar7 = (CordRepFlat *)0x1;
      if (0xf < len) {
        pCVar7 = absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>(len);
        (pCVar7->super_CordRep).length = 0;
        pCVar6 = (CordRepFlat *)(ulong)(byte)(this_00->rep_).field_0.short_rep.raw_size;
      }
      if (((ulong)pCVar6 & 1) == 0) {
        absl::lts_20250127::cord_internal::CordRepFlat::Delete
                  (&((this_00->rep_).field_0.long_rep.rep)->super_CordRep);
      }
      (this->buffer_).rep_.field_0.long_rep.rep = pCVar7;
      (this->buffer_).rep_.field_0.long_rep.padding = (void *)0x0;
      break;
    case kPartial:
      if ((bVar2 & 1) == 0) {
        pCVar7 = (this_00->rep_).field_0.long_rep.rep;
        bVar1 = (pCVar7->super_CordRep).tag;
        sVar11 = 0xc;
        if (bVar1 < 0xbb) {
          sVar11 = 6;
        }
        iVar14 = -0xb800d;
        if (bVar1 < 0xbb) {
          iVar14 = -0xe8d;
        }
        sVar8 = 3;
        if (0x42 < bVar1) {
          sVar8 = sVar11;
        }
        iVar12 = -0x1d;
        if (0x42 < bVar1) {
          iVar12 = iVar14;
        }
        uVar9 = (pCVar7->super_CordRep).length;
        uVar4 = (ulong)(int)(((uint)bVar1 << sVar8) + iVar12);
      }
      else {
        uVar9 = (ulong)cVar10;
        uVar4 = 0xf;
      }
      if (uVar4 <= uVar9) {
        __assert_fail("buffer_.length() < buffer_.capacity()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                      ,0x270,
                      "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
      }
      break;
    case kSteal:
      if ((bVar2 & 1) == 0) {
        sVar13 = (((this_00->rep_).field_0.long_rep.rep)->super_CordRep).length;
      }
      else {
        sVar13 = (size_t)cVar10;
      }
      if (sVar13 != 0) {
        __assert_fail("buffer_.length() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                      ,0x26b,
                      "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
      }
      if ((bVar1 & 1) == 0) {
        uVar9 = uVar9 >> 1;
      }
      else {
        uVar9 = ((this->cord_).contents_.data_.rep_.field_0.as_tree.rep)->length;
      }
      if (uVar9 == 0) {
        if (len < 0x10) {
          local_58.data[0] = '\x01';
          local_58.as_tree.cordz_info._1_7_ = 0;
          local_58.data[8] = '\0';
          local_58._9_7_ = 0;
        }
        else {
          pCVar7 = absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>(len);
          (pCVar7->super_CordRep).length = 0;
          local_58.data[0] = (char)pCVar7;
          local_58.as_tree.cordz_info._1_7_ = (undefined7)((ulong)pCVar7 >> 8);
        }
      }
      else {
        absl::lts_20250127::Cord::GetAppendBufferSlowPath
                  ((Cord *)&local_58.as_tree,(size_t)&this->cord_,0,len);
      }
      if (((this_00->rep_).field_0.short_rep.raw_size & 1U) == 0) {
        absl::lts_20250127::cord_internal::CordRepFlat::Delete
                  (&((this_00->rep_).field_0.long_rep.rep)->super_CordRep);
      }
      (this_00->rep_).field_0.long_rep.rep =
           (CordRepFlat *)CONCAT71(local_58.as_tree.cordz_info._1_7_,local_58.data[0]);
      (this->buffer_).rep_.field_0.long_rep.padding =
           (void *)CONCAT71(local_58._9_7_,local_58.data[8]);
      pCVar7 = (CordRepFlat *)(ulong)(byte)(this_00->rep_).field_0.short_rep.raw_size;
    }
  }
  if (((ulong)pCVar7 & 1) == 0) {
    SVar16 = absl::lts_20250127::CordBuffer::Rep::long_available(&this_00->rep_);
  }
  else {
    SVar16 = absl::lts_20250127::CordBuffer::Rep::short_available(&this_00->rep_);
  }
  uVar9 = SVar16.len_;
  if (uVar9 == 0) goto LAB_002e299e;
  *data = SVar16.ptr_;
  if (uVar15 < uVar9) {
    *size = (int)uVar15;
    bVar1 = (this_00->rep_).field_0.short_rep.raw_size;
    if ((bVar1 & 1) == 0) {
      pCVar7 = (this_00->rep_).field_0.long_rep.rep;
      bVar1 = (pCVar7->super_CordRep).tag;
      sVar11 = 0xc;
      if (bVar1 < 0xbb) {
        sVar11 = 6;
      }
      iVar14 = -0xb800d;
      if (bVar1 < 0xbb) {
        iVar14 = -0xe8d;
      }
      sVar8 = 3;
      if (0x42 < bVar1) {
        sVar8 = sVar11;
      }
      iVar12 = -0x1d;
      if (0x42 < bVar1) {
        iVar12 = iVar14;
      }
      uVar9 = (ulong)(int)(((uint)bVar1 << sVar8) + iVar12);
      if ((uVar9 < uVar15) || (uVar15 = uVar15 + (pCVar7->super_CordRep).length, uVar9 < uVar15)) {
LAB_002e2994:
        Next();
        goto LAB_002e2999;
      }
      (pCVar7->super_CordRep).length = uVar15;
    }
    else {
      if ((0xf < uVar15) || (0xf < (long)((char)bVar1 >> 1) + uVar15)) goto LAB_002e2994;
      (this_00->rep_).field_0.short_rep.raw_size = bVar1 + (char)uVar15 * '\x02';
    }
    SVar3 = kPartial;
    goto LAB_002e2980;
  }
  *size = (int)SVar16.len_;
  bVar1 = (this_00->rep_).field_0.short_rep.raw_size;
  if ((bVar1 & 1) == 0) {
    pCVar7 = (this_00->rep_).field_0.long_rep.rep;
    bVar1 = (pCVar7->super_CordRep).tag;
    sVar11 = 0xc;
    if (bVar1 < 0xbb) {
      sVar11 = 6;
    }
    iVar14 = -0xb800d;
    if (bVar1 < 0xbb) {
      iVar14 = -0xe8d;
    }
    sVar8 = 3;
    if (0x42 < bVar1) {
      sVar8 = sVar11;
    }
    iVar12 = -0x1d;
    if (0x42 < bVar1) {
      iVar12 = iVar14;
    }
    uVar4 = (ulong)(int)(((uint)bVar1 << sVar8) + iVar12);
    if ((uVar9 <= uVar4) && (uVar9 = (pCVar7->super_CordRep).length + uVar9, uVar9 <= uVar4)) {
      (pCVar7->super_CordRep).length = uVar9;
LAB_002e297b:
      SVar3 = kFull;
LAB_002e2980:
      this->state_ = SVar3;
      return true;
    }
  }
  else if ((uVar9 < 0x10) && (uVar9 + (long)((char)bVar1 >> 1) < 0x10)) {
    (this_00->rep_).field_0.short_rep.raw_size = bVar1 + (char)SVar16.len_ * '\x02';
    goto LAB_002e297b;
  }
LAB_002e2999:
  Next();
LAB_002e299e:
  __assert_fail("!span.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                ,0x27e,"virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
}

Assistant:

bool CordOutputStream::Next(void** data, int* size) {
  // Use 128 bytes as a minimum buffer size if we don't have any application
  // provided size hints. This number is picked somewhat arbitrary as 'small
  // enough to avoid excessive waste on small data, and large enough to not
  // waste CPU and memory on tiny buffer overhead'.
  // It is worth noting that absent size hints, we pick 'current size' as
  // the default buffer size (capped at max flat size), which means we quickly
  // double the buffer size. This is in contrast to `Cord::Append()` functions
  // accepting strings which use a conservative 10% growth.
  static const size_t kMinBlockSize = 128;

  size_t desired_size, max_size;
  const size_t cord_size = cord_.size() + buffer_.length();
  if (size_hint_ > cord_size) {
    // Try to hit size_hint_ exactly so the caller doesn't receive a larger
    // buffer than indicated, requiring a non-zero call to BackUp() to undo
    // the buffer capacity we returned beyond the indicated size hint.
    desired_size = size_hint_ - cord_size;
    max_size = desired_size;
  } else {
    // We're past the size hint or don't have a size hint.  Try to allocate a
    // block as large as what we have so far, or at least kMinBlockSize bytes.
    // CordBuffer will truncate this to an appropriate size if it is too large.
    desired_size = std::max(cord_size, kMinBlockSize);
    max_size = std::numeric_limits<size_t>::max();
  }

  switch (state_) {
    case State::kSteal:
      // Steal last buffer from Cord if available.
      assert(buffer_.length() == 0);
      buffer_ = cord_.GetAppendBuffer(desired_size);
      break;
    case State::kPartial:
      // Use existing capacity in 'buffer_`
      assert(buffer_.length() < buffer_.capacity());
      break;
    case State::kFull:
      assert(buffer_.length() > 0);
      cord_.Append(std::move(buffer_));
      [[fallthrough]];
    case State::kEmpty:
      assert(buffer_.length() == 0);
      buffer_ = absl::CordBuffer::CreateWithDefaultLimit(desired_size);
      break;
  }

  // Get all available capacity from the buffer.
  absl::Span<char> span = buffer_.available();
  assert(!span.empty());
  *data = span.data();

  // Only hand out up to 'max_size', which is limited if there is a size hint
  // specified, and we have more available than the size hint.
  if (span.size() > max_size) {
    *size = static_cast<int>(max_size);
    buffer_.IncreaseLengthBy(max_size);
    state_ = State::kPartial;
  } else {
    *size = static_cast<int>(span.size());
    buffer_.IncreaseLengthBy(span.size());
    state_ = State::kFull;
  }

  return true;
}